

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::reorder_edges_t::operator()
          (reorder_edges_t *this,vertex_index_t *first_vertex,int param_3)

{
  pointer ppVar1;
  vertex_index_t *in_RSI;
  long in_RDI;
  directed_flag_complex_cell_t cell;
  unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  *in_stack_ffffffffffffff98;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  vector<float,_std::allocator<float>_> *this_01;
  directed_flag_complex_cell_t local_28 [2];
  
  directed_flag_complex_cell_t::directed_flag_complex_cell_t(local_28,in_RSI);
  if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
    this_01 = *(vector<float,_std::allocator<float>_> **)(in_RDI + 8);
    std::
    unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ::find(in_stack_ffffffffffffff98,(key_type *)0x1d7aea);
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_false,_true>
                           *)0x1d7af9);
    std::vector<float,_std::allocator<float>_>::operator[](this_01,ppVar1->second);
    std::vector<float,_std::allocator<float>_>::push_back(this_01,in_stack_ffffffffffffffa8);
  }
  this_00 = *(vector<unsigned_short,_std::allocator<unsigned_short>_> **)(in_RDI + 0x18);
  directed_flag_complex_cell_t::vertex(local_28,0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (this_00,(value_type_conflict1 *)in_stack_ffffffffffffff98);
  directed_flag_complex_cell_t::vertex(local_28,1);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (this_00,(value_type_conflict1 *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int) {
		directed_flag_complex_cell_t cell(first_vertex);
		if (reorder_filtration) new_filtration.push_back(old_filtration[cell_hash.find(cell)->second]);
		new_edges.push_back(cell.vertex(0));
		new_edges.push_back(cell.vertex(1));
	}